

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9Builtin_nl2br(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_value *pObj;
  bool bVar1;
  undefined8 in_RAX;
  char *pcVar2;
  int nLen_00;
  char *zString;
  char *pcVar3;
  bool bVar4;
  int nLen;
  int local_34;
  
  local_34 = (int)((ulong)in_RAX >> 0x20);
  if (nArg < 1) {
    jx9_value_string(pCtx->pRet,"",0);
  }
  else {
    pcVar2 = jx9_value_to_string(*apArg,&local_34);
    if (local_34 < 1) {
      jx9MemObjRelease(pCtx->pRet);
    }
    else {
      bVar4 = true;
      if (nArg != 1) {
        pObj = apArg[1];
        jx9MemObjToBool(pObj);
        bVar4 = *(int *)&pObj->x == 0;
      }
      pcVar3 = pcVar2 + local_34;
LAB_0013146c:
      zString = pcVar2;
      if (pcVar2 < pcVar3) {
        do {
          if ((*zString == '\n') || (*zString == '\r')) {
            bVar1 = true;
            goto LAB_00131499;
          }
          zString = zString + 1;
        } while (zString < pcVar3);
        bVar1 = false;
      }
      else {
        bVar1 = false;
      }
LAB_00131499:
      if (pcVar2 < zString) {
        jx9_value_string(pCtx->pRet,pcVar2,(int)zString - (int)pcVar2);
      }
      if (bVar1) {
        if (bVar4) {
          pcVar2 = "<br/>";
          nLen_00 = 5;
        }
        else {
          pcVar2 = "<br>";
          nLen_00 = 4;
        }
        jx9_value_string(pCtx->pRet,pcVar2,nLen_00);
        for (pcVar2 = zString; (pcVar2 < pcVar3 && ((*pcVar2 == '\r' || (*pcVar2 == '\n'))));
            pcVar2 = pcVar2 + 1) {
        }
        if (zString < pcVar2) {
          jx9_value_string(pCtx->pRet,zString,(int)pcVar2 - (int)zString);
        }
        goto LAB_0013146c;
      }
    }
  }
  return 0;
}

Assistant:

static int jx9Builtin_nl2br(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zIn, *zCur, *zEnd;
	int is_xhtml = 0;
	int nLen;
	if( nArg < 1 ){
		/* Missing arguments, return the empty string */
		jx9_result_string(pCtx, "", 0);
		return JX9_OK;
	}
	/* Extract the target string */
	zIn = jx9_value_to_string(apArg[0], &nLen);
	if( nLen < 1 ){
		/* Empty string, return null */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	if( nArg > 1 ){
		is_xhtml = jx9_value_to_bool(apArg[1]);
	}
	zEnd = &zIn[nLen];
	/* Perform the requested operation */
	for(;;){
		zCur = zIn;
		/* Delimit the string */
		while( zIn < zEnd && (zIn[0] != '\n'&& zIn[0] != '\r') ){
			zIn++;
		}
		if( zCur < zIn ){
			/* Output chunk verbatim */
			jx9_result_string(pCtx, zCur, (int)(zIn-zCur));
		}
		if( zIn >= zEnd ){
			/* No more input to process */
			break;
		}
		/* Output the HTML line break */
		if( is_xhtml ){
			jx9_result_string(pCtx, "<br>", (int)sizeof("<br>")-1);
		}else{
			jx9_result_string(pCtx, "<br/>", (int)sizeof("<br/>")-1);
		}
		zCur = zIn;
		/* Append trailing line */
		while( zIn < zEnd && (zIn[0] == '\n'  || zIn[0] == '\r') ){
			zIn++;
		}
		if( zCur < zIn ){
			/* Output chunk verbatim */
			jx9_result_string(pCtx, zCur, (int)(zIn-zCur));
		}
	}
	return JX9_OK;
}